

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

int io::posix::detail::open_mode_to_posix_mode(open_mode m)

{
  open_mode oVar1;
  uint local_10;
  int p;
  open_mode m_local;
  
  operator&(m,read_only);
  oVar1 = operator&(m,write_only);
  local_10 = (uint)(oVar1 != 0);
  oVar1 = operator&(m,read_write);
  if (oVar1 != 0) {
    local_10 = local_10 | 2;
  }
  oVar1 = operator&(m,truncate);
  if (oVar1 != 0) {
    local_10 = local_10 | 0x200;
  }
  oVar1 = operator&(m,append);
  if (oVar1 != 0) {
    local_10 = local_10 | 0x400;
  }
  oVar1 = operator&(m,create);
  if (oVar1 != 0) {
    local_10 = local_10 | 0x40;
  }
  oVar1 = operator&(m,always_create);
  if (oVar1 != 0) {
    local_10 = local_10 | 0xc0;
  }
  return local_10;
}

Assistant:

constexpr int open_mode_to_posix_mode(open_mode m)
{
    int p = 0;
    if ((m & open_mode::read_only) != static_cast<open_mode>(0)) {
        p |= O_RDONLY;
    }
    if ((m & open_mode::write_only) != static_cast<open_mode>(0)) {
        p |= O_WRONLY;
    }
    if ((m & open_mode::read_write) != static_cast<open_mode>(0)) {
        p |= O_RDWR;
    }
    if ((m & open_mode::truncate) != static_cast<open_mode>(0)) {
        p |= O_TRUNC;
    }
    if ((m & open_mode::append) != static_cast<open_mode>(0)) {
        p |= O_APPEND;
    }
    if ((m & open_mode::create) != static_cast<open_mode>(0)) {
        p |= O_CREAT;
    }
    if ((m & open_mode::always_create) != static_cast<open_mode>(0)) {
        p |= (O_CREAT | O_EXCL);
    }

    return p;
}